

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall
Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int,_int> *map,Var_conflict *max)

{
  bool bVar1;
  uint uVar2;
  Var_conflict VVar3;
  Lit *pLVar4;
  uchar *tbs;
  Clause *in_RDX;
  size_t *siglen;
  FILE *in_RSI;
  uchar *sig;
  Solver *in_RDI;
  size_t in_R8;
  int i;
  lbool *in_stack_ffffffffffffff98;
  FILE *in_stack_ffffffffffffffa0;
  Solver *in_stack_ffffffffffffffa8;
  Lit in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint x;
  uint local_2c;
  
  bVar1 = satisfied(in_RDI,(Clause *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0.x)
                   );
  if (!bVar1) {
    local_2c = 0;
    while( true ) {
      x = local_2c;
      uVar2 = Clause::size(in_RDX);
      tbs = (uchar *)(ulong)uVar2;
      if ((int)uVar2 <= (int)x) break;
      Clause::operator[](in_RDX,local_2c);
      value(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
      bVar1 = lbool::operator!=(in_stack_ffffffffffffff98,
                                (lbool)(uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
      if (bVar1) {
        sig = (uchar *)(ulong)local_2c;
        in_stack_ffffffffffffffa0 = in_RSI;
        pLVar4 = Clause::operator[](in_RDX,local_2c);
        uVar2 = Minisat::sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar4->x,sig,siglen,tbs,in_R8);
        in_stack_ffffffffffffffa8 = (Solver *)0xf15e93;
        if ((uVar2 & 1) != 0) {
          in_stack_ffffffffffffffa8 = (Solver *)0xefdccc;
        }
        pLVar4 = Clause::operator[](in_RDX,local_2c);
        Minisat::var((Lit)pLVar4->x);
        VVar3 = mapVar(x,(vec<int,_int> *)in_stack_ffffffffffffffa8,
                       &in_stack_ffffffffffffffa0->_flags);
        fprintf(in_stack_ffffffffffffffa0,"%s%d ",in_stack_ffffffffffffffa8,(ulong)(VVar3 + 1));
      }
      local_2c = local_2c + 1;
    }
    fprintf(in_RSI,"0\n");
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, Clause& c, vec<Var>& map, Var& max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max)+1);
    fprintf(f, "0\n");
}